

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O2

bool __thiscall
Qentem::Value<char>::SetCharAndLength<unsigned_int>(Value<char> *this,char **key,uint *length)

{
  uint uVar1;
  char *pcVar2;
  
LAB_0012075d:
  switch(this->type_) {
  case ValuePtr:
    goto switchD_0012076f_caseD_1;
  default:
    return false;
  case String:
    *key = (char *)(this->field_0).array_.storage_;
    uVar1 = (this->field_0).array_.index_;
    goto LAB_001207a5;
  case True:
    pcVar2 = "true";
    break;
  case False:
    *key = "false";
    uVar1 = 5;
    goto LAB_001207a5;
  case Null:
    pcVar2 = "null";
  }
  *key = pcVar2;
  uVar1 = 4;
LAB_001207a5:
  *length = uVar1;
  return true;
switchD_0012076f_caseD_1:
  this = (this->field_0).array_.storage_;
  goto LAB_0012075d;
}

Assistant:

bool SetCharAndLength(const Char_T *&key, Number_T &length) const noexcept {
        switch (Type()) {
            case ValueType::String: {
                key    = string_.First();
                length = Number_T{string_.Length()};
                return true;
            }

            case ValueType::True: {
                key    = JSONotation::TrueString;
                length = JSONotation::TrueStringLength;
                return true;
            }

            case ValueType::False: {
                key    = JSONotation::FalseString;
                length = JSONotation::FalseStringLength;
                return true;
            }

            case ValueType::Null: {
                key    = JSONotation::NullString;
                length = JSONotation::NullStringLength;
                return true;
            }

            case ValueType::ValuePtr: {
                return value_->SetCharAndLength(key, length);
            }

            default: {
                return false;
            }
        }
    }